

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_internal.c
# Opt level: O0

void http_on_response_handler______internal(http_s *h,http_settings_s *settings)

{
  undefined1 local_38 [8];
  fio_str_info_s val;
  FIOBJ t;
  http_settings_s *settings_local;
  http_s *h_local;
  
  if (http_upgrade_hash == 0) {
    http_upgrade_hash = fiobj_hash_string("upgrade",7);
  }
  h->udata = settings->udata;
  val.data = (char *)fiobj_hash_get2(h->headers,http_upgrade_hash);
  if (val.data == (char *)0x0) {
    (*settings->on_response)(h);
  }
  else {
    fiobj_obj2cstr((fio_str_info_s *)local_38,(FIOBJ)val.data);
    (*settings->on_upgrade)(h,(char *)val.len,val.capa);
  }
  return;
}

Assistant:

void http_on_response_handler______internal(http_s *h,
                                            http_settings_s *settings) {
  if (!http_upgrade_hash)
    http_upgrade_hash = fiobj_hash_string("upgrade", 7);
  h->udata = settings->udata;
  FIOBJ t = fiobj_hash_get2(h->headers, http_upgrade_hash);
  if (t == FIOBJ_INVALID) {
    settings->on_response(h);
    return;
  } else {
    fio_str_info_s val = fiobj_obj2cstr(t);
    settings->on_upgrade(h, val.data, val.len);
  }
}